

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathSubstringFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  int start_00;
  int iVar1;
  xmlXPathObjectPtr pxVar2;
  xmlChar *val;
  xmlXPathObjectPtr pxVar3;
  double dVar4;
  double dVar5;
  xmlChar *ret;
  double end;
  double rle;
  double rin;
  int j;
  int i;
  double in;
  double le;
  xmlXPathObjectPtr len;
  xmlXPathObjectPtr start;
  xmlXPathObjectPtr str;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  in = 0.0;
  rin._4_4_ = 1;
  rin._0_4_ = 0x7fffffff;
  if (nargs < 2) {
    if (ctxt == (xmlXPathParserContextPtr)0x0) {
      return;
    }
    if (nargs != 2) {
      xmlXPathErr(ctxt,0xc);
      return;
    }
    if (ctxt->valueNr < 2) {
      xmlXPathErr(ctxt,0x17);
      return;
    }
  }
  if (3 < nargs) {
    if (ctxt == (xmlXPathParserContextPtr)0x0) {
      return;
    }
    if (nargs != 3) {
      xmlXPathErr(ctxt,0xc);
      return;
    }
    if (ctxt->valueNr < 3) {
      xmlXPathErr(ctxt,0x17);
      return;
    }
  }
  if (nargs == 3) {
    if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_NUMBER)) {
      xmlXPathNumberFunction(ctxt,1);
    }
    if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_NUMBER)) {
      xmlXPathErr(ctxt,0xb);
      return;
    }
    pxVar2 = valuePop(ctxt);
    in = pxVar2->floatval;
    xmlXPathReleaseObject(ctxt->context,pxVar2);
  }
  if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_NUMBER)) {
    xmlXPathNumberFunction(ctxt,1);
  }
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_NUMBER)) {
    xmlXPathErr(ctxt,0xb);
  }
  else {
    pxVar2 = valuePop(ctxt);
    dVar5 = pxVar2->floatval;
    xmlXPathReleaseObject(ctxt->context,pxVar2);
    if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
      xmlXPathStringFunction(ctxt,1);
    }
    if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_STRING)) {
      xmlXPathErr(ctxt,0xb);
    }
    else {
      pxVar2 = valuePop(ctxt);
      if (dVar5 < 2147483647.0) {
        if (1.0 <= dVar5) {
          rin._4_4_ = (int)dVar5;
          dVar4 = floor(dVar5);
          if (0.5 <= dVar5 - dVar4) {
            rin._4_4_ = rin._4_4_ + 1;
          }
        }
      }
      else {
        rin._4_4_ = 0x7fffffff;
      }
      if (nargs == 3) {
        rle = floor(dVar5);
        if (0.5 <= dVar5 - rle) {
          rle = rle + 1.0;
        }
        end = floor(in);
        if (0.5 <= in - end) {
          end = end + 1.0;
        }
        dVar5 = rle + end;
        if (1.0 <= dVar5) {
          if (dVar5 < 2147483647.0) {
            rin._0_4_ = (int)dVar5;
          }
        }
        else {
          rin._0_4_ = 1;
        }
      }
      start_00 = rin._4_4_ + -1;
      if ((start_00 < rin._0_4_ + -1) &&
         (iVar1 = xmlUTF8Strlen(pxVar2->stringval), start_00 < iVar1)) {
        val = xmlUTF8Strsub(pxVar2->stringval,start_00,(rin._0_4_ + -1) - start_00);
        if (val == (xmlChar *)0x0) {
          xmlXPathPErrMemory(ctxt);
        }
        pxVar3 = xmlXPathCacheNewString(ctxt,val);
        valuePush(ctxt,pxVar3);
        (*xmlFree)(val);
      }
      else {
        pxVar3 = xmlXPathCacheNewCString(ctxt,"");
        valuePush(ctxt,pxVar3);
      }
      xmlXPathReleaseObject(ctxt->context,pxVar2);
    }
  }
  return;
}

Assistant:

void
xmlXPathSubstringFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr str, start, len;
    double le=0, in;
    int i = 1, j = INT_MAX;

    if (nargs < 2) {
	CHECK_ARITY(2);
    }
    if (nargs > 3) {
	CHECK_ARITY(3);
    }
    /*
     * take care of possible last (position) argument
    */
    if (nargs == 3) {
	CAST_TO_NUMBER;
	CHECK_TYPE(XPATH_NUMBER);
	len = valuePop(ctxt);
	le = len->floatval;
	xmlXPathReleaseObject(ctxt->context, len);
    }

    CAST_TO_NUMBER;
    CHECK_TYPE(XPATH_NUMBER);
    start = valuePop(ctxt);
    in = start->floatval;
    xmlXPathReleaseObject(ctxt->context, start);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    str = valuePop(ctxt);

    if (!(in < INT_MAX)) { /* Logical NOT to handle NaNs */
        i = INT_MAX;
    } else if (in >= 1.0) {
        i = (int)in;
        if (in - floor(in) >= 0.5)
            i += 1;
    }

    if (nargs == 3) {
        double rin, rle, end;

        rin = floor(in);
        if (in - rin >= 0.5)
            rin += 1.0;

        rle = floor(le);
        if (le - rle >= 0.5)
            rle += 1.0;

        end = rin + rle;
        if (!(end >= 1.0)) { /* Logical NOT to handle NaNs */
            j = 1;
        } else if (end < INT_MAX) {
            j = (int)end;
        }
    }

    i -= 1;
    j -= 1;

    if ((i < j) && (i < xmlUTF8Strlen(str->stringval))) {
        xmlChar *ret = xmlUTF8Strsub(str->stringval, i, j - i);
        if (ret == NULL)
            xmlXPathPErrMemory(ctxt);
	valuePush(ctxt, xmlXPathCacheNewString(ctxt, ret));
	xmlFree(ret);
    } else {
	valuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
    }

    xmlXPathReleaseObject(ctxt->context, str);
}